

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32_t field_number,FieldDescriptor *field,Message *message,
               CodedInputStream *input)

{
  byte bVar1;
  uint8_t *puVar2;
  bool bVar3;
  MessageLite *this;
  UnknownFieldSet *unknown_fields;
  pair<int,_int> pVar4;
  undefined8 extraout_RAX;
  int byte_limit;
  string_view str;
  Metadata MVar5;
  LogMessage local_30;
  
  MVar5 = Message::GetMetadata(message);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = Reflection::MutableUnknownFields(MVar5.reflection,message);
    bVar3 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar3;
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    ParseAndMergeMessageSetField();
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_30);
    _Unwind_Resume(extraout_RAX);
  }
  if (((bVar1 & 0x20) == 0) && (field->type_ == '\v')) {
    this = &Reflection::MutableMessage(MVar5.reflection,message,field,input->extension_factory_)->
            super_MessageLite;
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (byte_limit = (int)(char)*puVar2, -1 < (char)*puVar2)) {
      input->buffer_ = puVar2 + 1;
    }
    else {
      byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar4 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
    if ((-1 < (long)pVar4) && (bVar3 = MessageLite::MergePartialFromCodedStream(this,input), bVar3))
    {
      bVar3 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar4.first);
      return bVar3;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x169);
    str._M_str = "Extensions of MessageSets must be optional messages.";
    str._M_len = 0x34;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_30);
  }
  return false;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32_t field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == nullptr) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    ABSL_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}